

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

void __thiscall
icu_63::TimeZoneNamesImpl::initialize(TimeZoneNamesImpl *this,Locale *locale,UErrorCode *status)

{
  UBool UVar1;
  char *pcVar2;
  UResourceBundle *pUVar3;
  UHashtable *pUVar4;
  code *ctx;
  UnicodeString local_78;
  UChar *local_38;
  UChar *tzID;
  TimeZone *tz;
  UErrorCode *pUStack_20;
  UErrorCode tmpsts;
  UErrorCode *status_local;
  Locale *locale_local;
  TimeZoneNamesImpl *this_local;
  
  pUStack_20 = status;
  status_local = (UErrorCode *)locale;
  locale_local = (Locale *)this;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    tz._4_4_ = U_ZERO_ERROR;
    pcVar2 = Locale::getName((Locale *)status_local);
    pUVar3 = ures_open_63("icudt63l-zone",pcVar2,(UErrorCode *)((long)&tz + 4));
    this->fZoneStrings = pUVar3;
    pcVar2 = "zoneStrings";
    pUVar3 = ures_getByKeyWithFallback_63
                       (this->fZoneStrings,"zoneStrings",this->fZoneStrings,
                        (UErrorCode *)((long)&tz + 4));
    this->fZoneStrings = pUVar3;
    UVar1 = ::U_FAILURE(tz._4_4_);
    if (UVar1 == '\0') {
      pUVar4 = uhash_open_63(uhash_hashUChars_63,uhash_compareUChars_63,(undefined1 *)0x0,pUStack_20
                            );
      this->fMZNamesMap = pUVar4;
      ctx = uhash_compareUChars_63;
      pUVar4 = uhash_open_63(uhash_hashUChars_63,uhash_compareUChars_63,(undefined1 *)0x0,pUStack_20
                            );
      this->fTZNamesMap = pUVar4;
      UVar1 = ::U_FAILURE(*pUStack_20);
      if (UVar1 == '\0') {
        uhash_setValueDeleter_63(this->fMZNamesMap,deleteZNames);
        uhash_setValueDeleter_63(this->fTZNamesMap,deleteZNames);
        tzID = (UChar *)TimeZone::createDefault();
        local_38 = ZoneMeta::getCanonicalCLDRID((TimeZone *)tzID);
        if (local_38 != (UChar *)0x0) {
          UnicodeString::UnicodeString(&local_78,local_38);
          loadStrings(this,&local_78,pUStack_20);
          UnicodeString::~UnicodeString(&local_78);
        }
        if (tzID != (UChar *)0x0) {
          (**(code **)(*(long *)tzID + 8))();
        }
      }
      else {
        cleanup(this,(EVP_PKEY_CTX *)ctx);
      }
    }
    else {
      *pUStack_20 = tz._4_4_;
      cleanup(this,(EVP_PKEY_CTX *)pcVar2);
    }
  }
  return;
}

Assistant:

void
TimeZoneNamesImpl::initialize(const Locale& locale, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return;
    }

    // Load zoneStrings bundle
    UErrorCode tmpsts = U_ZERO_ERROR;   // OK with fallback warning..
    fZoneStrings = ures_open(U_ICUDATA_ZONE, locale.getName(), &tmpsts);
    fZoneStrings = ures_getByKeyWithFallback(fZoneStrings, gZoneStrings, fZoneStrings, &tmpsts);
    if (U_FAILURE(tmpsts)) {
        status = tmpsts;
        cleanup();
        return;
    }

    // Initialize hashtables holding time zone/meta zone names
    fMZNamesMap = uhash_open(uhash_hashUChars, uhash_compareUChars, NULL, &status);
    fTZNamesMap = uhash_open(uhash_hashUChars, uhash_compareUChars, NULL, &status);
    if (U_FAILURE(status)) {
        cleanup();
        return;
    }

    uhash_setValueDeleter(fMZNamesMap, deleteZNames);
    uhash_setValueDeleter(fTZNamesMap, deleteZNames);
    // no key deleters for name maps

    // preload zone strings for the default zone
    TimeZone *tz = TimeZone::createDefault();
    const UChar *tzID = ZoneMeta::getCanonicalCLDRID(*tz);
    if (tzID != NULL) {
        loadStrings(UnicodeString(tzID), status);
    }
    delete tz;

    return;
}